

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitElems
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this)

{
  Module *pMVar1;
  Table *pTVar2;
  pointer puVar3;
  pointer puVar4;
  char *pcVar5;
  Const *pCVar6;
  mapped_type *pmVar7;
  string_view root;
  IString IVar8;
  Builder local_38;
  Index tableIndex;
  __single_object e;
  
  pMVar1 = this->wasm;
  pTVar2 = (pMVar1->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  _tableIndex = (ElementSegment *)operator_new(0x50);
  ((string_view *)&((Type *)((long)_tableIndex + 0x30))->id)->_M_len = 0;
  (((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)_tableIndex + 0x38))->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)_tableIndex + 0x40) = (pointer)0x0;
  *(pointer *)((long)_tableIndex + 0x48) = (pointer)0x0;
  *(undefined8 *)_tableIndex = 0;
  *(char **)((long)_tableIndex + 8) = (char *)0x0;
  *(undefined8 *)((long)_tableIndex + 0x10) = 0;
  (((Name *)((long)_tableIndex + 0x18))->super_IString).str._M_len = 0;
  *(char **)((long)_tableIndex + 0x20) = (char *)0x0;
  *(Expression **)((long)_tableIndex + 0x28) = (Expression *)0x0;
  ((string_view *)&((Type *)((long)_tableIndex + 0x30))->id)->_M_len = 0x12;
  (((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)_tableIndex + 0x38))->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)_tableIndex + 0x40) = (pointer)0x0;
  *(pointer *)((long)_tableIndex + 0x48) = (pointer)0x0;
  pcVar5 = *(char **)((long)&(pTVar2->super_Importable).super_Named + 8);
  (((Name *)((long)_tableIndex + 0x18))->super_IString).str._M_len =
       (size_t)*(char **)&(pTVar2->super_Importable).super_Named;
  *(char **)((long)_tableIndex + 0x20) = pcVar5;
  local_38.wasm = pMVar1;
  pCVar6 = Builder::makeConstPtr(&local_38,0,(Type)0x2);
  *(Const **)((long)_tableIndex + 0x28) = pCVar6;
  pMVar1 = this->wasm;
  root = IString::interned((IString *)0xd,(string_view)ZEXT816(0xe4401f),SUB81(_tableIndex,0));
  IVar8.str = (string_view)Names::getValidElementSegmentName(pMVar1,root);
  *(string_view *)_tableIndex = IVar8.str;
  Module::addElementSegment
            (this->wasm,
             (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &tableIndex);
  pMVar1 = this->wasm;
  local_38.wasm._0_4_ =
       (int)((ulong)((long)(pMVar1->tables).
                           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pMVar1->tables).
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  puVar3 = (pMVar1->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pMVar1->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->implicitElemIndices,(key_type *)&local_38);
  *pmVar7 = (int)((ulong)((long)puVar4 - (long)puVar3) >> 3) - 1;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  if (_tableIndex != (ElementSegment *)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&tableIndex,_tableIndex);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitElems(TypeT, ElemListT&& elems) {
  auto& table = *wasm.tables.back();
  auto e = std::make_unique<ElementSegment>();
  e->table = table.name;
  e->offset = Builder(wasm).makeConstPtr(0, Type::i32);
  e->name = Names::getValidElementSegmentName(wasm, "implicit-elem");
  wasm.addElementSegment(std::move(e));

  // Record the index mapping so we can find this segment again to set its type
  // and elements in later phases.
  Index tableIndex = wasm.tables.size() - 1;
  Index elemIndex = wasm.elementSegments.size() - 1;
  implicitElemIndices[tableIndex] = elemIndex;

  return Ok{};
}